

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void Assimp::ExportSceneCollada
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar3;
  DeadlyImportError *pDVar4;
  allocator<char> local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string file;
  string path;
  ColladaExporter iDoTheExportThing;
  long *plVar2;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iDoTheExportThing,pFile,(allocator<char> *)&file);
  DefaultIOSystem::absolutePath(&path,(string *)&iDoTheExportThing);
  std::__cxx11::string::~string((string *)&iDoTheExportThing);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iDoTheExportThing,pFile,(allocator<char> *)&local_330);
  DefaultIOSystem::completeBaseName(&file,(string *)&iDoTheExportThing);
  std::__cxx11::string::~string((string *)&iDoTheExportThing);
  ColladaExporter::ColladaExporter(&iDoTheExportThing,pScene,pIOSystem,&path,&file);
  if (((&iDoTheExportThing.field_0x48)[*(long *)(iDoTheExportThing._40_8_ + -0x18)] & 5) != 0) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,pFile,&local_331);
    std::operator+(&local_330,"output data creation failed. Most likely the file became too large: "
                   ,&local_310);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_330);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    uVar3 = std::ostream::tellp();
    (**(code **)(*plVar2 + 0x18))(plVar2,local_330._M_dataplus._M_p,uVar3,1);
    std::__cxx11::string::~string((string *)&local_330);
    (**(code **)(*plVar2 + 8))(plVar2);
    ColladaExporter::~ColladaExporter(&iDoTheExportThing);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&path);
    return;
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,pFile,&local_331);
  std::operator+(&local_330,"could not open output .dae file: ",&local_310);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_330);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneCollada(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/) {
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // invoke the exporter
    ColladaExporter iDoTheExportThing( pScene, pIOSystem, path, file);
    
    if (iDoTheExportThing.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .dae file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}